

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
* __thiscall
testing::internal::
linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
::operator=(linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
            *this,linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
                  *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>>>const&>const>
    ::
    copy<testing::MatcherInterface<mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>>>const&>const>
              ((linked_ptr<testing::MatcherInterface<mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>>>const&>const>
                *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }